

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O3

bool __thiscall bitio::bitio_stream::is_eof(bitio_stream *this)

{
  byte bVar1;
  void *__ptr;
  size_t sVar2;
  
  bVar1 = 1;
  if ((this->eof == false) && (bVar1 = 0, this->byte_index == this->current_buffer_length)) {
    __ptr = operator_new__(1);
    sVar2 = fread(__ptr,1,1,(FILE *)this->file);
    this->eof = sVar2 == 0;
    free(__ptr);
    if (sVar2 == 0) {
      bVar1 = 1;
    }
    else {
      fseek((FILE *)this->file,-1,1);
      bVar1 = this->eof;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool bitio_stream::is_eof() {
    if (eof) return true;
    if (byte_index == current_buffer_length) {
        auto *tmp_ptr = new char[1];
        eof = fread(tmp_ptr, 1, 1, file) == 0;
        free(tmp_ptr);

        if (!eof) fseek(file, -1, SEEK_CUR);
    }
    return eof;
}